

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O2

ServicePublicationPtr __thiscall
miniros::ServiceManager::lookupServicePublication(ServiceManager *this,string *service)

{
  pthread_mutex_t *__mutex;
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  iterator __end1;
  string *psVar2;
  ServicePublicationPtr SVar3;
  
  __mutex = (pthread_mutex_t *)((long)&service->field_2 + 8);
  std::mutex::lock((mutex *)&__mutex->__data);
  psVar2 = service;
  do {
    psVar2 = (string *)(psVar2->_M_dataplus)._M_p;
    if (psVar2 == service) {
      (this->service_publications_).
      super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      (this->service_publications_).
      super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      goto LAB_00247075;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((psVar2->field_2)._M_allocated_capacity + 0x10),in_RDX);
  } while (!_Var1);
  std::__shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2> *)
             &psVar2->field_2);
LAB_00247075:
  pthread_mutex_unlock(__mutex);
  SVar3.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar3.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ServicePublicationPtr)
         SVar3.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServicePublicationPtr ServiceManager::lookupServicePublication(const std::string& service)
{
  std::scoped_lock<std::mutex> lock(service_publications_mutex_);

  for (const auto& pub: service_publications_)
  {
    if (pub->getName() == service)
      return pub;
  }

  return {};
}